

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O3

string * __thiscall
hanabi_learning_env::HanabiState::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HanabiState *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  size_type *psVar9;
  ulong uVar10;
  pointer pHVar11;
  uint uVar12;
  long lVar13;
  string __str_2;
  string __str;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = this->life_tokens_;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar12 = 1;
  if (9 < uVar3) {
    uVar10 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar5 = (uint)uVar10;
      if (uVar5 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0010eb1b;
      }
      if (uVar5 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0010eb1b;
      }
      if (uVar5 < 10000) goto LAB_0010eb1b;
      uVar10 = uVar10 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar5);
    uVar12 = uVar12 + 1;
  }
LAB_0010eb1b:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),uVar12,uVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1128ad);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70.field_2._8_8_ = plVar6[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_70._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  paVar1 = &local_98.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_98.field_2._M_allocated_capacity = *psVar9;
    local_98.field_2._8_8_ = plVar6[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar9;
    local_98._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_98._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  uVar2 = this->information_tokens_;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar12 = 1;
  if (9 < uVar3) {
    uVar10 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar5 = (uint)uVar10;
      if (uVar5 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0010ecac;
      }
      if (uVar5 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0010ecac;
      }
      if (uVar5 < 10000) goto LAB_0010ecac;
      uVar10 = uVar10 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar5);
    uVar12 = uVar12 + 1;
  }
LAB_0010ecac:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),uVar12,uVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1128bb);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70.field_2._8_8_ = plVar6[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_70._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_98.field_2._M_allocated_capacity = *psVar9;
    local_98.field_2._8_8_ = plVar6[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar9;
    local_98._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_98._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (0 < this->parent_game_->num_colors_) {
    lVar13 = 0;
    do {
      ColorIndexToChar((int)lVar13);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar2 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      uVar3 = -uVar2;
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
      uVar12 = 1;
      if (9 < uVar3) {
        uVar10 = (ulong)uVar3;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          uVar5 = (uint)uVar10;
          if (uVar5 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0010ee79;
          }
          if (uVar5 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0010ee79;
          }
          if (uVar5 < 10000) goto LAB_0010ee79;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar12 + 4;
        } while (99999 < uVar5);
        uVar12 = uVar12 + 1;
      }
LAB_0010ee79:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar12 - (char)((int)uVar2 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_70._M_dataplus._M_p + (uVar2 >> 0x1f),uVar12,uVar3);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = puVar7[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_98._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->parent_game_->num_colors_);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->hands_).
      super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->hands_).
      super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar10 = 0;
    do {
      if (lVar13 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (uVar10 == (uint)this->cur_player_) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      HanabiHand::ToString_abi_cxx11_
                (&local_98,
                 (HanabiHand *)
                 ((long)&(((this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_start)->cards_).
                         super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                         ._M_impl + lVar13));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
      uVar8 = ((long)(this->hands_).
                     super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->hands_).
                     super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      lVar13 = lVar13 + 0x30;
    } while (uVar10 <= uVar8 && uVar8 - uVar10 != 0);
  }
  uVar2 = (this->deck_).total_count_;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar12 = 1;
  if (9 < uVar3) {
    uVar10 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar5 = (uint)uVar10;
      if (uVar5 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0010f069;
      }
      if (uVar5 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0010f069;
      }
      if (uVar5 < 10000) goto LAB_0010f069;
      uVar10 = uVar10 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar5);
    uVar12 = uVar12 + 1;
  }
LAB_0010f069:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),uVar12,uVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1128f1);
  paVar1 = &local_70.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70.field_2._8_8_ = plVar6[3];
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_70._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_98.field_2._M_allocated_capacity = *psVar9;
    local_98.field_2._8_8_ = plVar6[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar9;
    local_98._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_98._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pHVar11 = (this->discard_pile_).
            super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->discard_pile_).
      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar11) {
    lVar13 = 0;
    uVar10 = 0;
    do {
      HanabiCard::ToString_abi_cxx11_(&local_70,(HanabiCard *)((long)&pHVar11->color_ + lVar13));
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x11210b);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = puVar7[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_98._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
      pHVar11 = (this->discard_pile_).
                super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 8;
    } while (uVar10 < (ulong)((long)(this->discard_pile_).
                                    super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar11 >> 3)
            );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiState::ToString() const {
  std::string result;
  result += "Life tokens: " + std::to_string(LifeTokens()) + "\n";
  result += "Info tokens: " + std::to_string(InformationTokens()) + "\n";
  result += "Fireworks: ";
  for (int i = 0; i < ParentGame()->NumColors(); ++i) {
    result += ColorIndexToChar(i);
    result += std::to_string(fireworks_[i]) + " ";
  }
  result += "\nHands:\n";
  for (int i = 0; i < hands_.size(); ++i) {
    if (i > 0) {
      result += "-----\n";
    }
    if (i == CurPlayer()) {
      result += "Cur player\n";
    }
    result += hands_[i].ToString();
  }
  result += "Deck size: " + std::to_string(Deck().Size()) + "\n";
  result += "Discards:";
  for (int i = 0; i < discard_pile_.size(); ++i) {
    result += " " + discard_pile_[i].ToString();
  }
  return result;
}